

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::substitute(SimpSolver *this,Var v,Lit x)

{
  uint64_t *puVar1;
  vec<Minisat::Lit,_int> *this_00;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  uint *puVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint *puVar9;
  Var local_48;
  Lit local_44;
  vec<unsigned_int,_int> *local_40;
  SimpSolver *local_38;
  
  local_48 = v;
  if ((this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v)
  goto LAB_00112511;
  if ((this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x224,"bool Minisat::SimpSolver::substitute(Var, Lit)");
  }
  if (v < (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz) {
    pcVar6 = (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
    if (pcVar6[v] != '\0') {
      __assert_fail("!isEliminated(v)",
                    "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                    ,0x225,"bool Minisat::SimpSolver::substitute(Var, Lit)");
    }
    if (v < (this->super_Solver).assigns.
            super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz) {
      bVar2 = (this->super_Solver).assigns.
              super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data[v].value;
      if ((bVar2 != l_Undef || (l_Undef & 2) != 0) && (l_Undef & 2 & bVar2) == 0) {
        __assert_fail("value(v) == l_Undef",
                      "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                      ,0x226,"bool Minisat::SimpSolver::substitute(Var, Lit)");
      }
      if ((this->super_Solver).ok == true) {
        pcVar6[v] = '\x01';
        if ((this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map
            .sz <= v) {
LAB_00112511:
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                        ,0x28,
                        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        pcVar6 = (this->super_Solver).decision.
                 super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
        if (pcVar6[v] != '\0') {
          puVar1 = &(this->super_Solver).dec_vars;
          *puVar1 = *puVar1 - 1;
        }
        pcVar6[v] = '\0';
        if (((this->super_Solver).order_heap.indices.map.sz <= v) ||
           ((this->super_Solver).order_heap.indices.map.data[v] < 0)) {
          if ((this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.
              map.sz <= v) goto LAB_00112511;
          if ((this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.
              map.data[v] != '\0') {
            Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
                      (&(this->super_Solver).order_heap,v);
          }
        }
        local_40 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                   ::lookup(&this->occurs,&local_48);
        bVar4 = true;
        if (0 < local_40->sz) {
          this_00 = &(this->super_Solver).add_tmp;
          lVar7 = 0;
          local_38 = this;
          do {
            puVar5 = local_40->data;
            uVar3 = puVar5[lVar7];
            if ((this->super_Solver).ca.ra.sz <= uVar3) {
              __assert_fail("r < sz",
                            "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Alloc.h"
                            ,0x3f,
                            "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            if ((this->super_Solver).add_tmp.data != (Lit *)0x0) {
              (this->super_Solver).add_tmp.sz = 0;
            }
            puVar9 = (this->super_Solver).ca.ra.memory + uVar3;
            if (0x1f < *puVar9) {
              uVar8 = 0;
              do {
                uVar3 = puVar9[uVar8 + 1];
                local_44.x = uVar3 & 1 ^ x.x;
                if ((int)uVar3 >> 1 != local_48) {
                  local_44.x = uVar3;
                }
                vec<Minisat::Lit,_int>::push(this_00,&local_44);
                uVar8 = uVar8 + 1;
              } while (uVar8 < *puVar9 >> 5);
              puVar5 = local_40->data;
              this = local_38;
            }
            removeClause(this,puVar5[lVar7]);
            bVar4 = addClause_(this,this_00);
            if (!bVar4) {
              (this->super_Solver).ok = false;
              goto LAB_001124e1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < local_40->sz);
          bVar4 = true;
        }
      }
      else {
LAB_001124e1:
        bVar4 = false;
      }
      return bVar4;
    }
    pcVar6 = 
    "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
  }
  else {
    pcVar6 = 
    "const V &Minisat::IntMap<int, char>::operator[](K) const [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                ,0x27,pcVar6);
}

Assistant:

bool SimpSolver::substitute(Var v, Lit x)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    if (!ok) return false;

    eliminated[v] = true;
    setDecisionVar(v, false);
    const vec<CRef>& cls = occurs.lookup(v);
    
    vec<Lit>& subst_clause = add_tmp;
    for (int i = 0; i < cls.size(); i++){
        Clause& c = ca[cls[i]];

        subst_clause.clear();
        for (int j = 0; j < c.size(); j++){
            Lit p = c[j];
            subst_clause.push(var(p) == v ? x ^ sign(p) : p);
        }

        removeClause(cls[i]);

        if (!addClause_(subst_clause))
            return ok = false;
    }

    return true;
}